

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner.cpp
# Opt level: O1

bool __thiscall
node::BlockAssembler::TestPackageTransactions(BlockAssembler *this,setEntries *package)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var4 = (package->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((bVar2 = (_Rb_tree_header *)p_Var4 == &(package->_M_t)._M_impl.super__Rb_tree_header,
         !bVar2 && (bVar3 = IsFinalTx((CTransaction *)**(undefined8 **)(p_Var4 + 1),this->nHeight,
                                      this->m_lock_time_cutoff), bVar3))) {
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockAssembler::TestPackageTransactions(const CTxMemPool::setEntries& package) const
{
    for (CTxMemPool::txiter it : package) {
        if (!IsFinalTx(it->GetTx(), nHeight, m_lock_time_cutoff)) {
            return false;
        }
    }
    return true;
}